

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::WriteUnitySourceInclude
          (cmLocalGenerator *this,ostream *unity_file,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cond,string *sf_full_path,cmValue beforeInclude,cmValue afterInclude,cmValue uniqueIdName
          )

{
  string_view input;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  string *psVar4;
  string local_170;
  undefined1 local_150 [8];
  cmCryptoHash hasher;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_90 [8];
  string path;
  string local_68 [7];
  anon_class_1_0_00000001 PathEqOrSubDir;
  string pathToHash;
  string *sf_full_path_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *cond_local;
  ostream *unity_file_local;
  cmLocalGenerator *this_local;
  cmValue uniqueIdName_local;
  cmValue afterInclude_local;
  cmValue beforeInclude_local;
  
  this_local = (cmLocalGenerator *)uniqueIdName.Value;
  uniqueIdName_local = afterInclude;
  afterInclude_local = beforeInclude;
  bVar1 = std::optional::operator_cast_to_bool((optional *)cond);
  if (bVar1) {
    poVar3 = std::operator<<(unity_file,"#if ");
    pbVar2 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(cond);
    poVar3 = std::operator<<(poVar3,(string *)pbVar2);
    std::operator<<(poVar3,"\n");
  }
  bVar1 = cmNonempty((cmValue)this_local);
  if (bVar1) {
    std::__cxx11::string::string(local_68);
    cmsys::SystemTools::GetFilenamePath((string *)local_90,sf_full_path);
    psVar4 = GetBinaryDirectory_abi_cxx11_(this);
    bVar1 = WriteUnitySourceInclude::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)(path.field_2._M_local_buf + 0xf),
                       (string *)local_90,psVar4);
    if (bVar1) {
      psVar4 = GetBinaryDirectory_abi_cxx11_(this);
      cmSystemTools::RelativePath(&local_e0,psVar4,sf_full_path);
      std::operator+(&local_c0,"BLD_",&local_e0);
      std::__cxx11::string::operator=(local_68,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    else {
      psVar4 = GetSourceDirectory_abi_cxx11_(this);
      bVar1 = WriteUnitySourceInclude::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)(path.field_2._M_local_buf + 0xf),
                         (string *)local_90,psVar4);
      if (bVar1) {
        psVar4 = GetSourceDirectory_abi_cxx11_(this);
        cmSystemTools::RelativePath(&local_120,psVar4,sf_full_path);
        std::operator+(&local_100,"SRC_",&local_120);
        std::__cxx11::string::operator=(local_68,(string *)&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &hasher.CTX,"ABS_",sf_full_path);
        std::__cxx11::string::operator=(local_68,(string *)&hasher.CTX);
        std::__cxx11::string::~string((string *)&hasher.CTX);
      }
    }
    cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_150,AlgoMD5);
    poVar3 = std::operator<<(unity_file,"/* ");
    poVar3 = std::operator<<(poVar3,local_68);
    poVar3 = std::operator<<(poVar3," */\n");
    poVar3 = std::operator<<(poVar3,"#undef ");
    psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)&this_local);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"#define ");
    psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)&this_local);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3," unity_");
    input = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_68);
    cmCryptoHash::HashString_abi_cxx11_(&local_170,(cmCryptoHash *)local_150,input);
    poVar3 = std::operator<<(poVar3,(string *)&local_170);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_170);
    cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_150);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string(local_68);
  }
  bVar1 = cmValue::operator_cast_to_bool(&afterInclude_local);
  if (bVar1) {
    psVar4 = cmValue::operator*[abi_cxx11_(&afterInclude_local);
    poVar3 = std::operator<<(unity_file,(string *)psVar4);
    std::operator<<(poVar3,"\n");
  }
  std::operator<<(unity_file,"/* NOLINTNEXTLINE(bugprone-suspicious-include) */\n");
  poVar3 = std::operator<<(unity_file,"#include \"");
  poVar3 = std::operator<<(poVar3,(string *)sf_full_path);
  std::operator<<(poVar3,"\"\n");
  bVar1 = cmValue::operator_cast_to_bool(&uniqueIdName_local);
  if (bVar1) {
    psVar4 = cmValue::operator*[abi_cxx11_(&uniqueIdName_local);
    poVar3 = std::operator<<(unity_file,(string *)psVar4);
    std::operator<<(poVar3,"\n");
  }
  bVar1 = std::optional::operator_cast_to_bool((optional *)cond);
  if (bVar1) {
    std::operator<<(unity_file,"#endif\n");
  }
  std::operator<<(unity_file,"\n");
  return;
}

Assistant:

void cmLocalGenerator::WriteUnitySourceInclude(
  std::ostream& unity_file, cm::optional<std::string> const& cond,
  std::string const& sf_full_path, cmValue beforeInclude, cmValue afterInclude,
  cmValue uniqueIdName) const
{
  if (cond) {
    unity_file << "#if " << *cond << "\n";
  }

  if (cmNonempty(uniqueIdName)) {
    std::string pathToHash;
    auto PathEqOrSubDir = [](std::string const& a, std::string const& b) {
      return (cmSystemTools::ComparePath(a, b) ||
              cmSystemTools::IsSubDirectory(a, b));
    };
    const auto path = cmSystemTools::GetFilenamePath(sf_full_path);
    if (PathEqOrSubDir(path, this->GetBinaryDirectory())) {
      pathToHash = "BLD_" +
        cmSystemTools::RelativePath(this->GetBinaryDirectory(), sf_full_path);
    } else if (PathEqOrSubDir(path, this->GetSourceDirectory())) {
      pathToHash = "SRC_" +
        cmSystemTools::RelativePath(this->GetSourceDirectory(), sf_full_path);
    } else {
      pathToHash = "ABS_" + sf_full_path;
    }
    cmCryptoHash hasher(cmCryptoHash::AlgoMD5);
    unity_file << "/* " << pathToHash << " */\n"
               << "#undef " << *uniqueIdName << "\n"
               << "#define " << *uniqueIdName << " unity_"
               << hasher.HashString(pathToHash) << "\n";
  }

  if (beforeInclude) {
    unity_file << *beforeInclude << "\n";
  }

  unity_file << "/* NOLINTNEXTLINE(bugprone-suspicious-include) */\n";
  unity_file << "#include \"" << sf_full_path << "\"\n";

  if (afterInclude) {
    unity_file << *afterInclude << "\n";
  }
  if (cond) {
    unity_file << "#endif\n";
  }
  unity_file << "\n";
}